

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::AssetPath>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *result)

{
  AssetPath *__first;
  AssetPath *__last;
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  char c;
  AssetPath value;
  bool triple_deliminated;
  char local_95;
  undefined4 local_94;
  AssetPath local_90;
  string local_50;
  
  __first = (result->
            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __last = (result->
           super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::value::AssetPath*>(__first,__last);
    (result->
    super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>).
    _M_impl.super__Vector_impl_data._M_finish = __first;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    local_94 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
    local_90.asset_path_._M_dataplus._M_p = (pointer)&local_90.asset_path_.field_2;
    local_90.asset_path_._M_string_length = 0;
    local_90.asset_path_.field_2._M_local_buf[0] = '\0';
    local_90.resolved_path_._M_dataplus._M_p = (pointer)&local_90.resolved_path_.field_2;
    local_90.resolved_path_._M_string_length = 0;
    local_90.resolved_path_.field_2._M_local_buf[0] = '\0';
    bVar2 = ParseAssetIdentifier(this,&local_90,(bool *)&local_50);
    if (bVar2) {
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      push_back(result,&local_90);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar4 = &local_90.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.resolved_path_._M_dataplus._M_p != &local_90.resolved_path_.field_2) {
      operator_delete(local_90.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_90.resolved_path_.field_2._M_allocated_capacity._1_7_,
                               local_90.resolved_path_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.asset_path_._M_dataplus._M_p != paVar4) {
      operator_delete(local_90.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_90.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_90.asset_path_.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_0037f8c5;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,&local_95);
        if (!bVar2) {
          return false;
        }
        if (local_95 == sep) {
          bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = LookChar1(this,(char *)&local_90);
          if (!bVar2) {
            return false;
          }
          iVar5 = 3;
          if ((char)local_90.asset_path_._M_dataplus._M_p != (char)local_94) goto LAB_0037f7fb;
        }
        else {
LAB_0037f7fb:
          if (local_95 != sep) {
            pSVar1 = this->_sr;
            if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
              pSVar1->idx_ = uVar3;
            }
            goto LAB_0037f8c5;
          }
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          local_90.asset_path_._M_string_length = 0;
          local_90.asset_path_.field_2._M_local_buf[0] = '\0';
          local_90.resolved_path_._M_dataplus._M_p = (pointer)&local_90.resolved_path_.field_2;
          local_90.resolved_path_._M_string_length = 0;
          local_90.resolved_path_.field_2._M_local_buf[0] = '\0';
          local_90.asset_path_._M_dataplus._M_p = (pointer)paVar4;
          bVar2 = ParseAssetIdentifier(this,&local_90,(bool *)&local_50);
          iVar5 = 3;
          if (bVar2) {
            ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
            push_back(result,&local_90);
            iVar5 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.resolved_path_._M_dataplus._M_p != &local_90.resolved_path_.field_2) {
            operator_delete(local_90.resolved_path_._M_dataplus._M_p,
                            CONCAT71(local_90.resolved_path_.field_2._M_allocated_capacity._1_7_,
                                     local_90.resolved_path_.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.asset_path_._M_dataplus._M_p != paVar4) {
            operator_delete(local_90.asset_path_._M_dataplus._M_p,
                            CONCAT71(local_90.asset_path_.field_2._M_allocated_capacity._1_7_,
                                     local_90.asset_path_.field_2._M_local_buf[0]) + 1);
          }
        }
      } while (iVar5 == 0);
      if (iVar5 != 1) {
LAB_0037f8c5:
        if ((result->
            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_90.asset_path_._M_dataplus._M_p = (pointer)paVar4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Empty array.\n","");
        PushError(this,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.asset_path_._M_dataplus._M_p != paVar4) {
          operator_delete(local_90.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_90.asset_path_.field_2._M_allocated_capacity._1_7_,
                                   local_90.asset_path_.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}